

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

BOOL __thiscall
Js::JavascriptArray::SetAccessors
          (JavascriptArray *this,PropertyId propertyId,Var getter,Var setter,
          PropertyOperationFlags flags)

{
  BOOL BVar1;
  int iVar2;
  undefined8 in_RAX;
  DynamicTypeHandler *pDVar3;
  undefined4 extraout_var;
  uint32 local_34 [2];
  uint32 index;
  
  local_34[0] = (uint32)((ulong)in_RAX >> 0x20);
  BVar1 = ScriptContext::IsNumericPropertyId
                    ((((((this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.
                        ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
                     ptr,propertyId,local_34);
  if (BVar1 == 0) {
    BVar1 = DynamicObject::SetAccessors((DynamicObject *)this,propertyId,getter,setter,flags);
  }
  else {
    pDVar3 = DynamicObject::GetTypeHandler((DynamicObject *)this);
    iVar2 = (*pDVar3->_vptr_DynamicTypeHandler[0x48])(pDVar3,this);
    BVar1 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x180))
                      ((long *)CONCAT44(extraout_var,iVar2),this,local_34[0],getter,setter);
  }
  return BVar1;
}

Assistant:

BOOL JavascriptArray::SetAccessors(PropertyId propertyId, Var getter, Var setter, PropertyOperationFlags flags)
    {
        ScriptContext* scriptContext = this->GetScriptContext();

        uint32 index;
        if (scriptContext->IsNumericPropertyId(propertyId, &index))
        {
            return GetTypeHandler()->ConvertToTypeWithItemAttributes(this)
                ->SetItemAccessors(this, index, getter, setter);
        }

        return __super::SetAccessors(propertyId, getter, setter, flags);
    }